

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O3

uint32_t cpu_rddsp_mips(uint32_t mask_num,CPUMIPSState_conflict *env)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint32_t ruler;
  uint32_t i;
  long lVar4;
  uint uVar5;
  uint8_t uVar6;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  undefined1 auVar7 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint8_t mask [6];
  
  ruler = 1;
  lVar4 = 0;
  do {
    bVar2 = (byte)lVar4 & 0x1f;
    mask[lVar4] = (uint8_t)((ruler & mask_num) >> bVar2);
    ruler = ruler * 2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  uVar1 = (env->active_tc).DSPControl;
  uVar10 = SUB41(mask._0_4_,3);
  uVar9 = SUB41(mask._0_4_,2);
  uVar8 = SUB41(mask._0_4_,1);
  uVar6 = (uint8_t)mask._0_4_;
  auVar12[0] = -(uVar6 == '\x01');
  auVar12[1] = -(uVar6 == '\x01');
  auVar12[2] = -(uVar6 == '\x01');
  auVar12[3] = -(uVar6 == '\x01');
  auVar12[4] = -(uVar8 == '\x01');
  auVar12[5] = -(uVar8 == '\x01');
  auVar12[6] = -(uVar8 == '\x01');
  auVar12[7] = -(uVar8 == '\x01');
  auVar12[8] = -(uVar9 == '\x01');
  auVar12[9] = -(uVar9 == '\x01');
  auVar12[10] = -(uVar9 == '\x01');
  auVar12[0xb] = -(uVar9 == '\x01');
  auVar12[0xc] = -(uVar10 == '\x01');
  auVar12[0xd] = -(uVar10 == '\x01');
  auVar12[0xe] = -(uVar10 == '\x01');
  auVar12[0xf] = -(uVar10 == '\x01');
  auVar11._4_4_ = uVar1;
  auVar11._0_4_ = uVar1;
  auVar11._8_4_ = uVar1;
  auVar11._12_4_ = uVar1;
  auVar12 = auVar11 & auVar12 & _DAT_00d83360;
  uVar5 = 0 >> bVar2;
  uVar3 = uVar1 & 0xf000000;
  if (mask[4] != '\x01') {
    uVar3 = uVar5;
  }
  uVar1 = uVar1 & 0x4000;
  if (mask[5] != '\x01') {
    uVar1 = uVar5;
  }
  auVar7._0_8_ = auVar12._8_8_;
  auVar7._8_4_ = auVar12._8_4_;
  auVar7._12_4_ = auVar12._12_4_;
  return uVar1 | uVar3 | SUB164(auVar7 | auVar12,4) | SUB164(auVar7 | auVar12,0);
}

Assistant:

uint32_t cpu_rddsp(uint32_t mask_num, CPUMIPSState *env)
{
    uint8_t  mask[6];
    uint32_t ruler, i;
    target_ulong temp;
    target_ulong dsp;

    ruler = 0x01;
    for (i = 0; i < 6; i++) {
        mask[i] = (mask_num & ruler) >> i ;
        ruler = ruler << 1;
    }

    temp  = 0x00;
    dsp = env->active_tc.DSPControl;

    if (mask[0] == 1) {
#if defined(TARGET_MIPS64)
        temp |= dsp & 0x7F;
#else
        temp |= dsp & 0x3F;
#endif
    }

    if (mask[1] == 1) {
        temp |= dsp & 0x1F80;
    }

    if (mask[2] == 1) {
        temp |= dsp & 0x2000;
    }

    if (mask[3] == 1) {
        temp |= dsp & 0x00FF0000;
    }

    if (mask[4] == 1) {
#if defined(TARGET_MIPS64)
        temp |= dsp & 0xFF000000;
#else
        temp |= dsp & 0x0F000000;
#endif
    }

    if (mask[5] == 1) {
        temp |= dsp & 0x4000;
    }

    return temp;
}